

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

void mriStepInnerStepper_PrintMem(MRIStepInnerStepper stepper,FILE *outfile)

{
  FILE *in_RSI;
  long in_RDI;
  
  if (in_RDI != 0) {
    fprintf(in_RSI,"MRIStepInnerStepper Mem:\n");
    fprintf(in_RSI,"MRIStepInnerStepper: inner_nforcing = %i\n",(ulong)*(uint *)(in_RDI + 0x20));
  }
  return;
}

Assistant:

void mriStepInnerStepper_PrintMem(MRIStepInnerStepper stepper, FILE* outfile)
{
#ifdef SUNDIALS_DEBUG_PRINTVEC
  int i;
#endif
  if (stepper == NULL) { return; }

  /* output data from the inner stepper */
  fprintf(outfile, "MRIStepInnerStepper Mem:\n");
  fprintf(outfile, "MRIStepInnerStepper: inner_nforcing = %i\n",
          stepper->nforcing);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  if (stepper->forcing != NULL)
  {
    for (i = 0; i < stepper->nforcing; i++)
    {
      fprintf(outfile, "MRIStep: inner_forcing[%i]:\n", i);
      N_VPrintFile(stepper->forcing[i], outfile);
    }
  }
#endif

  return;
}